

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::GetArrayCopy<aiQuatKey>(aiQuatKey **dest,ai_uint num)

{
  aiQuatKey *__src;
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  aiQuatKey *paVar4;
  aiQuatKey *local_38;
  aiQuatKey *old;
  ai_uint num_local;
  aiQuatKey **dest_local;
  
  if (*dest != (aiQuatKey *)0x0) {
    __src = *dest;
    uVar2 = CONCAT44(0,num);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    paVar4 = (aiQuatKey *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_38 = paVar4;
      do {
        aiQuatKey::aiQuatKey(local_38);
        local_38 = local_38 + 1;
      } while (local_38 != paVar4 + uVar2);
    }
    *dest = paVar4;
    memcpy(*dest,__src,(ulong)num * 0x18);
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}